

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

size_t __thiscall
merlin::graphical_model::induced_width(graphical_model *this,variable_order_t *order)

{
  size_type __n;
  ulong uVar1;
  index i_00;
  const_iterator ci;
  _Map_pointer __n_00;
  pointer pvVar2;
  bool bVar3;
  variable_set *pvVar4;
  size_t j_00;
  const_reference pvVar5;
  reference pvVar6;
  my_set<merlin::edge_id> *v_00;
  pointer peVar7;
  unsigned_long *puVar8;
  _Self *__x;
  reference puVar9;
  variable vVar10;
  size_t v;
  size_t u;
  _Self local_268;
  _Base_ptr local_260;
  _Rb_tree_const_iterator<unsigned_long> local_258;
  iterator it2;
  iterator it1;
  size_type local_230;
  size_t j_1;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_220;
  const_iterator si;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  my_set<merlin::edge_id> ns;
  size_t pos;
  size_t var;
  size_t i_2;
  size_t i_1;
  undefined1 local_1a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  size_t j;
  variable_set *pvStack_168;
  size_t local_160;
  size_t sStack_158;
  undefined1 local_150 [8];
  const_iterator cj;
  variable_set *vi;
  size_t i;
  undefined1 local_110 [8];
  graph g;
  size_t n;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  size_t width;
  variable_order_t *order_local;
  graphical_model *this_local;
  
  adj.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mrf((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&n,this);
  g.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(order);
  graph::graph((graph *)local_110,
               (size_t)g.m_evacant.c.
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
  for (vi = (variable_set *)0x0;
      pvVar4 = (variable_set *)
               std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::size
                         ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&n)
      , __n_00 = g.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node, vi < pvVar4;
      vi = (variable_set *)
           ((long)&(vi->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1)) {
    cj.m_tmp.m_states =
         (size_t)std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                 operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                            &n,(size_type)vi);
    variable_set::begin((const_iterator *)local_150,(variable_set *)cj.m_tmp.m_states);
    while( true ) {
      variable_set::end((const_iterator *)&j,(variable_set *)cj.m_tmp.m_states);
      ci.m_vs = pvStack_168;
      ci.m_i = j;
      ci.m_tmp.m_label = local_160;
      ci.m_tmp.m_states = sStack_158;
      bVar3 = variable_set::const_iterator::operator!=((const_iterator *)local_150,ci);
      if (!bVar3) break;
      vVar10 = variable_set::const_iterator::operator*((const_iterator *)local_150);
      position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)vVar10.m_label;
      j_00 = _vindex(this,(variable *)
                          &position.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      graph::add_edge((graph *)local_110,(index)vi,j_00);
      variable_set::const_iterator::operator++((const_iterator *)local_150);
    }
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,(size_type)__n_00,
             (allocator<unsigned_long> *)((long)&i_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  for (i_2 = 0; i_2 < g.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node; i_2 = i_2 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](order,i_2);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,*pvVar5);
    *pvVar6 = i_2;
  }
  for (var = 0; pvVar2 = adj.
                         super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
      var < g.m_evacant.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node; var = var + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](order,var);
    __n = *pvVar5;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,__n);
    uVar1 = *pvVar6;
    v_00 = graph::neighbors((graph *)local_110,__n);
    my_set<merlin::edge_id>::my_set
              ((my_set<merlin::edge_id> *)&S._M_t._M_impl.super__Rb_tree_header._M_node_count,v_00);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&si);
    local_220._M_current =
         (edge_id *)
         my_set<merlin::edge_id>::begin
                   ((my_set<merlin::edge_id> *)&S._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      j_1 = (size_t)my_set<merlin::edge_id>::end
                              ((my_set<merlin::edge_id> *)
                               &S._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar3 = __gnu_cxx::operator!=
                        (&local_220,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&j_1);
      if (!bVar3) break;
      peVar7 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_220);
      local_230 = peVar7->second;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,
                          local_230);
      if (uVar1 < *pvVar6) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &si,&local_230);
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_220);
    }
    it1._M_node = (_Base_ptr)
                  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&si);
    puVar8 = std::max<unsigned_long>
                       ((unsigned_long *)
                        &adj.
                         super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&it1);
    adj.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&it2);
    std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_258);
    local_260 = (_Base_ptr)
                std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&si);
    it2 = (iterator)local_260;
    while( true ) {
      local_268._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&si);
      bVar3 = std::operator!=(&it2,&local_268);
      if (!bVar3) break;
      local_258._M_node = it2._M_node;
      while( true ) {
        __x = std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_258);
        u = (size_t)std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&si);
        bVar3 = std::operator!=(__x,(_Self *)&u);
        if (!bVar3) break;
        puVar9 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&it2);
        i_00 = *puVar9;
        puVar9 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_258);
        if (i_00 != *puVar9) {
          graph::add_edge((graph *)local_110,i_00,*puVar9);
        }
      }
      std::_Rb_tree_const_iterator<unsigned_long>::operator++(&it2);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&si);
    my_set<merlin::edge_id>::~my_set
              ((my_set<merlin::edge_id> *)&S._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0);
  graph::~graph((graph *)local_110);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
            ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&n);
  return (size_t)pvVar2;
}

Assistant:

size_t induced_width(const variable_order_t& order) const {
		//return pseudo_tree_size(order).first;

		size_t width = 0;
		std::vector<variable_set> adj = mrf();
		size_t n = order.size();
		graph g(n); // create the graph
		for (size_t i = 0; i < adj.size(); ++i) {
			const variable_set& vi = adj[i];
			for (variable_set::const_iterator cj = vi.begin();
					cj != vi.end(); ++cj) {
				size_t j = _vindex(*cj);
				g.add_edge(i, j);
			}
		}

		std::vector<size_t> position(n);
		for (size_t i = 0; i < n; ++i) {
			position[order[i]] = i;
		}

		// eliminate variables and create induced edges
		for (size_t i = 0; i < n; ++i) {
			size_t var = order[i];
			size_t pos = position[var];

			// find the neighbors appearing later in the ordering
			const my_set<edge_id> ns = g.neighbors(var);
			std::set<size_t> S;
			for (my_set<edge_id>::const_iterator si = ns.begin();
					si != ns.end(); ++si) {
				size_t j = si->second;
				if (position[j] > pos) {
					S.insert(j);
				}
			}

			// connect the neighbors appearing later in the ordering
			width = std::max(width, S.size());
			std::set<size_t>::iterator it1, it2;
			for (it1 = S.begin(); it1 != S.end(); ++it1) {
				it2 = it1;
				while (++it2 != S.end()) {
					size_t u = *it1, v = *it2;
					if (u != v) g.add_edge(u, v);
				}
			}
		}

		return width;
	}